

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O0

mat4f * transposed(mat4f *a)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  mat4f *in_RSI;
  mat4f *in_RDI;
  vec4f local_48;
  vec4f local_38;
  vec4f local_28;
  vec4f local_18;
  mat4f *local_8;
  
  local_8 = in_RSI;
  pfVar4 = mat4f::operator[](in_RSI,0);
  fVar1 = *pfVar4;
  pfVar4 = mat4f::operator[](local_8,0);
  fVar2 = pfVar4[1];
  pfVar4 = mat4f::operator[](local_8,0);
  fVar3 = pfVar4[2];
  pfVar4 = mat4f::operator[](local_8,0);
  vec4f::vec4f(&local_18,fVar1,fVar2,fVar3,pfVar4[3]);
  pfVar4 = mat4f::operator[](local_8,1);
  fVar1 = *pfVar4;
  pfVar4 = mat4f::operator[](local_8,1);
  fVar2 = pfVar4[1];
  pfVar4 = mat4f::operator[](local_8,1);
  fVar3 = pfVar4[2];
  pfVar4 = mat4f::operator[](local_8,1);
  vec4f::vec4f(&local_28,fVar1,fVar2,fVar3,pfVar4[3]);
  pfVar4 = mat4f::operator[](local_8,2);
  fVar1 = *pfVar4;
  pfVar4 = mat4f::operator[](local_8,2);
  fVar2 = pfVar4[1];
  pfVar4 = mat4f::operator[](local_8,2);
  fVar3 = pfVar4[2];
  pfVar4 = mat4f::operator[](local_8,2);
  vec4f::vec4f(&local_38,fVar1,fVar2,fVar3,pfVar4[3]);
  pfVar4 = mat4f::operator[](local_8,3);
  fVar1 = *pfVar4;
  pfVar4 = mat4f::operator[](local_8,3);
  fVar2 = pfVar4[1];
  pfVar4 = mat4f::operator[](local_8,3);
  fVar3 = pfVar4[2];
  pfVar4 = mat4f::operator[](local_8,3);
  vec4f::vec4f(&local_48,fVar1,fVar2,fVar3,pfVar4[3]);
  mat4f::mat4f(in_RDI,&local_18,&local_28,&local_38,&local_48);
  return in_RDI;
}

Assistant:

inline mat4f transposed(const mat4f& a) {
	return mat4f(
		vec4f(a[0][0], a[0][1], a[0][2], a[0][3]),
		vec4f(a[1][0], a[1][1], a[1][2], a[1][3]),
		vec4f(a[2][0], a[2][1], a[2][2], a[2][3]),
		vec4f(a[3][0], a[3][1], a[3][2], a[3][3])
	);
}